

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_1_block(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  int *piVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  (G->data).line_number_stack_size = (G->data).line_number_stack_size + 1;
  piVar1 = (int *)realloc((G->data).line_number_stack,(G->data).line_number_stack_size << 2);
  (G->data).line_number_stack = piVar1;
  if ((G->data).line_number_stack == (int *)0x0) {
    abort();
  }
  (G->data).line_number_stack[(G->data).line_number_stack_size - 1] = (G->data).line_number;
  G->val[-1] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_1_block(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s G->val[-1]
  yyprintf((stderr, "do yy_1_block"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {ENTER; s=NULL; }\n"));
  ENTER; s=NULL; ;
#undef s
}